

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-timeout.c
# Opt level: O3

int run_test_tcp_connect_timeout(void)

{
  sa_family_t sVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_connect_t *puVar3;
  uv_loop_t *puVar4;
  long lVar5;
  anon_union_28_2_e90107a3_for_address *paVar6;
  ulong uVar7;
  undefined8 unaff_RBX;
  int iVar8;
  char *pcVar9;
  uv_timer_t *puVar10;
  uv_loop_t *unaff_R14;
  bool bVar11;
  sockaddr_in addr;
  undefined1 auStack_4f0 [8];
  void *pvStack_4e8;
  sockaddr_in6 sStack_4e0;
  undefined8 uStack_4c0;
  uv_loop_t *puStack_4b8;
  void *pvStack_4a8;
  code *pcStack_4a0;
  undefined1 auStack_490 [27];
  undefined5 uStack_475;
  undefined3 uStack_470;
  char acStack_378 [768];
  code *pcStack_78;
  long lStack_68;
  long lStack_60;
  sockaddr_in sStack_58;
  undefined8 uStack_48;
  uv_loop_t *puStack_40;
  code *pcStack_38;
  code *pcStack_30;
  sockaddr_in local_20;
  
  pcVar9 = "8.8.8.8";
  iVar8 = 9999;
  pcStack_30 = (code *)0x17ced5;
  iVar2 = uv_ip4_addr("8.8.8.8",9999,&local_20);
  if (iVar2 == 0) {
    pcStack_30 = (code *)0x17cee2;
    puVar3 = (uv_connect_t *)uv_default_loop();
    iVar8 = 0x34ec38;
    pcStack_30 = (code *)0x17cef1;
    iVar2 = uv_timer_init((uv_loop_t *)puVar3,&timer);
    if (iVar2 != 0) goto LAB_0017cfc8;
    puVar10 = &timer;
    iVar8 = 0x17cfe6;
    pcStack_30 = (code *)0x17cf13;
    iVar2 = uv_timer_start(&timer,timer_cb,0x32,0);
    puVar3 = (uv_connect_t *)puVar10;
    if (iVar2 != 0) goto LAB_0017cfcd;
    pcStack_30 = (code *)0x17cf20;
    puVar3 = (uv_connect_t *)uv_default_loop();
    iVar8 = 0x34ecd0;
    pcStack_30 = (code *)0x17cf2f;
    iVar2 = uv_tcp_init((uv_loop_t *)puVar3,&conn);
    if (iVar2 != 0) goto LAB_0017cfd2;
    puVar3 = &connect_req;
    iVar8 = 0x34ecd0;
    pcStack_30 = (code *)0x17cf56;
    iVar2 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)&local_20,connect_cb);
    if (iVar2 != 0) {
      if (iVar2 == -0x65) {
        pcStack_30 = (code *)0x17cfbc;
        run_test_tcp_connect_timeout_cold_7();
        return 1;
      }
      goto LAB_0017cfd7;
    }
    pcStack_30 = (code *)0x17cf5f;
    puVar3 = (uv_connect_t *)uv_default_loop();
    iVar8 = 0;
    pcStack_30 = (code *)0x17cf69;
    iVar2 = uv_run((uv_loop_t *)puVar3,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0017cfdc;
    pcStack_30 = (code *)0x17cf72;
    unaff_R14 = uv_default_loop();
    unaff_RBX._0_4_ = 0;
    unaff_RBX._4_4_ = 0;
    pcStack_30 = (code *)0x17cf88;
    uv_walk(unaff_R14,close_walk_cb,(void *)0x0);
    iVar8 = 0;
    pcStack_30 = (code *)0x17cf92;
    uv_run(unaff_R14,UV_RUN_DEFAULT);
    pcStack_30 = (code *)0x17cf97;
    puVar3 = (uv_connect_t *)uv_default_loop();
    pcStack_30 = (code *)0x17cf9f;
    iVar2 = uv_loop_close((uv_loop_t *)puVar3);
    if (iVar2 == 0) {
      pcStack_30 = (code *)0x17cfa8;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_30 = (code *)0x17cfc8;
    run_test_tcp_connect_timeout_cold_1();
    puVar3 = (uv_connect_t *)pcVar9;
LAB_0017cfc8:
    pcStack_30 = (code *)0x17cfcd;
    run_test_tcp_connect_timeout_cold_2();
LAB_0017cfcd:
    pcStack_30 = (code *)0x17cfd2;
    run_test_tcp_connect_timeout_cold_3();
LAB_0017cfd2:
    pcStack_30 = (code *)0x17cfd7;
    run_test_tcp_connect_timeout_cold_4();
LAB_0017cfd7:
    pcStack_30 = (code *)0x17cfdc;
    run_test_tcp_connect_timeout_cold_8();
LAB_0017cfdc:
    pcStack_30 = (code *)0x17cfe1;
    run_test_tcp_connect_timeout_cold_5();
  }
  pcStack_30 = timer_cb;
  run_test_tcp_connect_timeout_cold_6();
  pcStack_30 = (code *)unaff_RBX;
  if ((uv_timer_t *)puVar3 == &timer) {
    pcStack_38 = (code *)0x17d009;
    uv_close((uv_handle_t *)&conn,close_cb);
    uv_close((uv_handle_t *)&timer,close_cb);
    return extraout_EAX;
  }
  pcStack_38 = connect_cb;
  timer_cb_cold_1();
  if (puVar3 == &connect_req) {
    if (iVar8 == -0x7d) {
      connect_cb_called = connect_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  else {
    puStack_40 = (uv_loop_t *)0x17d03d;
    connect_cb_cold_1();
  }
  puStack_40 = (uv_loop_t *)run_test_tcp_local_connect_timeout;
  connect_cb_cold_2();
  pcStack_78 = (code *)0x17d04e;
  uStack_48 = unaff_RBX;
  puStack_40 = unaff_R14;
  iVar2 = is_supported_system();
  if (iVar2 == 0) {
    pcStack_78 = (code *)0x17d1d7;
    run_test_tcp_local_connect_timeout_cold_9();
    return 1;
  }
  lStack_60 = 0;
  pcStack_78 = (code *)0x17d075;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_58);
  lStack_68 = (long)iVar2;
  if (lStack_60 == lStack_68) {
    pcStack_78 = (code *)0x17d091;
    puVar4 = uv_default_loop();
    pcStack_78 = (code *)0x17d0a0;
    iVar2 = uv_timer_init(puVar4,&timer);
    lStack_60 = (long)iVar2;
    lStack_68 = 0;
    if (lStack_60 != 0) goto LAB_0017d1f4;
    pcStack_78 = (code *)0x17d0da;
    iVar2 = uv_timer_start(&timer,timer_cb,1000,0);
    lStack_60 = (long)iVar2;
    lStack_68 = 0;
    if (lStack_60 != 0) goto LAB_0017d203;
    pcStack_78 = (code *)0x17d0ff;
    puVar4 = uv_default_loop();
    pcStack_78 = (code *)0x17d10e;
    iVar2 = uv_tcp_init(puVar4,&conn);
    lStack_60 = (long)iVar2;
    lStack_68 = 0;
    if (lStack_60 != 0) goto LAB_0017d212;
    pcStack_78 = (code *)0x17d14d;
    iVar2 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)&sStack_58,connect_local_cb);
    if (iVar2 == -0x65) {
      pcStack_78 = (code *)0x17d1de;
      run_test_tcp_local_connect_timeout_cold_8();
      return 1;
    }
    lStack_60 = (long)iVar2;
    lStack_68 = 0;
    if (lStack_60 != 0) goto LAB_0017d221;
    pcStack_78 = (code *)0x17d17b;
    puVar4 = uv_default_loop();
    pcStack_78 = (code *)0x17d185;
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0017d230;
    pcStack_78 = (code *)0x17d192;
    unaff_R14 = uv_default_loop();
    unaff_RBX._0_4_ = 0;
    unaff_RBX._4_4_ = 0;
    pcStack_78 = (code *)0x17d1a8;
    uv_walk(unaff_R14,close_walk_cb,(void *)0x0);
    pcStack_78 = (code *)0x17d1b2;
    uv_run(unaff_R14,UV_RUN_DEFAULT);
    pcStack_78 = (code *)0x17d1b7;
    puVar4 = uv_default_loop();
    pcStack_78 = (code *)0x17d1bf;
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      pcStack_78 = (code *)0x17d1c8;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_78 = (code *)0x17d1f4;
    run_test_tcp_local_connect_timeout_cold_1();
LAB_0017d1f4:
    pcStack_78 = (code *)0x17d203;
    run_test_tcp_local_connect_timeout_cold_2();
LAB_0017d203:
    pcStack_78 = (code *)0x17d212;
    run_test_tcp_local_connect_timeout_cold_3();
LAB_0017d212:
    pcStack_78 = (code *)0x17d221;
    run_test_tcp_local_connect_timeout_cold_4();
LAB_0017d221:
    pcStack_78 = (code *)0x17d230;
    run_test_tcp_local_connect_timeout_cold_5();
LAB_0017d230:
    pcStack_78 = (code *)0x17d235;
    run_test_tcp_local_connect_timeout_cold_6();
  }
  pcStack_78 = is_supported_system;
  run_test_tcp_local_connect_timeout_cold_7();
  pcStack_4a0 = (code *)0x17d24c;
  pcStack_78 = (code *)unaff_RBX;
  iVar2 = uv_os_uname((uv_utsname_t *)(auStack_490 + 0x18));
  auStack_490._0_8_ = SEXT48(iVar2);
  auStack_490._16_8_ = (void *)0x0;
  if ((void *)auStack_490._0_8_ == (void *)0x0) {
    if (CONCAT35(uStack_470,uStack_475) == 0x544e5f73776f64 &&
        CONCAT53(uStack_475,auStack_490._24_3_) == 0x5f73776f646e6957) {
      pcStack_4a0 = (code *)0x17d2c6;
      iVar2 = sscanf(acStack_378,"%d.%d.%d",auStack_490,auStack_490 + 4,auStack_490 + 8);
      if (iVar2 != 3) {
        return 0;
      }
      lVar5 = 0;
      do {
        if (*(int *)((long)&DAT_001b13d4 + lVar5) < *(int *)(auStack_490 + lVar5)) {
          return 1;
        }
        if (*(int *)(auStack_490 + lVar5) < *(int *)((long)&DAT_001b13d4 + lVar5)) {
          return 0;
        }
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0xc);
    }
    return 1;
  }
  puVar3 = (uv_connect_t *)auStack_490;
  iVar2 = (int)auStack_490 + 0x10;
  pcStack_4a0 = connect_local_cb;
  is_supported_system_cold_1();
  if (puVar3 == &connect_req) {
    pcStack_4a0 = (code *)(long)iVar2;
    pvStack_4a8 = (void *)0xffffffffffffff83;
    if (pcStack_4a0 != (code *)0xffffffffffffff83) {
      connect_cb_called = connect_cb_called + 1;
      return iVar2;
    }
  }
  else {
    puStack_4b8 = (uv_loop_t *)0x17d33d;
    connect_local_cb_cold_1();
  }
  puStack_4b8 = (uv_loop_t *)run_test_tcp6_local_connect_timeout;
  connect_local_cb_cold_2();
  uStack_4c0 = unaff_RBX;
  puStack_4b8 = unaff_R14;
  iVar2 = is_supported_system();
  if (iVar2 == 0) {
    run_test_tcp6_local_connect_timeout_cold_10();
    return 1;
  }
  iVar2 = uv_interface_addresses((uv_interface_address_t **)&sStack_4e0,(int *)auStack_4f0);
  if (iVar2 != 0) {
LAB_0017d557:
    run_test_tcp6_local_connect_timeout_cold_1();
    return 1;
  }
  if ((long)(int)auStack_4f0._0_4_ < 1) {
    uv_free_interface_addresses((uv_interface_address_t *)sStack_4e0._0_8_,auStack_4f0._0_4_);
    goto LAB_0017d557;
  }
  paVar6 = (anon_union_28_2_e90107a3_for_address *)(sStack_4e0._0_8_ + 0x14);
  uVar7 = 1;
  do {
    sVar1 = (paVar6->address4).sin_family;
    if (sVar1 == 10) break;
    paVar6 = (anon_union_28_2_e90107a3_for_address *)((long)paVar6 + 0x50);
    bVar11 = uVar7 < (ulong)(long)(int)auStack_4f0._0_4_;
    uVar7 = uVar7 + 1;
  } while (bVar11);
  uv_free_interface_addresses((uv_interface_address_t *)sStack_4e0._0_8_,auStack_4f0._0_4_);
  if (sVar1 != 10) goto LAB_0017d557;
  auStack_4f0 = (undefined1  [8])0x0;
  iVar2 = uv_ip6_addr("::1",9999,&sStack_4e0);
  pvStack_4e8 = (void *)(long)iVar2;
  if (auStack_4f0 == (undefined1  [8])pvStack_4e8) {
    puVar4 = uv_default_loop();
    iVar2 = uv_timer_init(puVar4,&timer);
    auStack_4f0 = (undefined1  [8])(long)iVar2;
    pvStack_4e8 = (void *)0x0;
    if (auStack_4f0 != (undefined1  [8])0x0) goto LAB_0017d581;
    iVar2 = uv_timer_start(&timer,timer_cb,1000,0);
    auStack_4f0 = (undefined1  [8])(long)iVar2;
    pvStack_4e8 = (void *)0x0;
    if (auStack_4f0 != (undefined1  [8])0x0) goto LAB_0017d590;
    puVar4 = uv_default_loop();
    iVar2 = uv_tcp_init(puVar4,&conn);
    auStack_4f0 = (undefined1  [8])(long)iVar2;
    pvStack_4e8 = (void *)0x0;
    if (auStack_4f0 != (undefined1  [8])0x0) goto LAB_0017d59f;
    iVar2 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)&sStack_4e0,connect_local_cb);
    if (iVar2 == -0x65) {
      run_test_tcp6_local_connect_timeout_cold_9();
      return 1;
    }
    auStack_4f0 = (undefined1  [8])(long)iVar2;
    pvStack_4e8 = (void *)0x0;
    if (auStack_4f0 != (undefined1  [8])0x0) goto LAB_0017d5ae;
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_4f0 = (undefined1  [8])(long)iVar2;
    pvStack_4e8 = (void *)0x0;
    if (auStack_4f0 == (undefined1  [8])0x0) {
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar2 = uv_loop_close(puVar4);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0017d5cc;
    }
  }
  else {
    run_test_tcp6_local_connect_timeout_cold_2();
LAB_0017d581:
    run_test_tcp6_local_connect_timeout_cold_3();
LAB_0017d590:
    run_test_tcp6_local_connect_timeout_cold_4();
LAB_0017d59f:
    run_test_tcp6_local_connect_timeout_cold_5();
LAB_0017d5ae:
    run_test_tcp6_local_connect_timeout_cold_6();
  }
  puVar4 = (uv_loop_t *)auStack_4f0;
  run_test_tcp6_local_connect_timeout_cold_7();
LAB_0017d5cc:
  run_test_tcp6_local_connect_timeout_cold_8();
  if (puVar4 == (uv_loop_t *)&timer || puVar4 == (uv_loop_t *)&conn) {
    close_cb_called = close_cb_called + 1;
    return (int)CONCAT71(0x34ec,puVar4 == (uv_loop_t *)&conn);
  }
  close_cb_cold_1();
  iVar2 = uv_is_closing((uv_handle_t *)puVar4);
  if (iVar2 == 0) {
    uv_close((uv_handle_t *)puVar4,(uv_close_cb)0x0);
    return extraout_EAX_01;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(tcp_connect_timeout) {
  struct sockaddr_in addr;
  int r;

  ASSERT(0 == uv_ip4_addr("8.8.8.8", 9999, &addr));

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT(r == 0);

  r = uv_timer_start(&timer, timer_cb, 50, 0);
  ASSERT(r == 0);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}